

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CConsole::Print(CConsole *this,int Level,char *pFrom,char *pStr,bool Highlighted)

{
  undefined8 in_RCX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 in_R8B;
  long in_FS_OFFSET;
  int i;
  char aBuf [1024];
  char aTimeBuf [80];
  undefined4 in_stack_fffffffffffffb80;
  int iVar1;
  undefined3 in_stack_fffffffffffffb84;
  uint uVar2;
  char local_458 [128];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = CONCAT13(in_R8B,in_stack_fffffffffffffb84) & 0x1ffffff;
  str_timestamp_format
            ((char *)(CONCAT44(CONCAT13(in_R8B,in_stack_fffffffffffffb84),in_stack_fffffffffffffb80)
                     & 0x1ffffffffffffff),(int)((ulong)in_RDI >> 0x20),(char *)0x22acaa);
  str_format(local_458,0x400,"[%s][%s]: %s",local_58,in_RDX,in_RCX);
  dbg_msg(in_RDX,"%s",in_RCX);
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0xc0); iVar1 = iVar1 + 1) {
    if ((in_ESI <= *(int *)(in_RDI + 0x60 + (long)iVar1 * 0x18)) &&
       (*(long *)(in_RDI + (long)iVar1 * 0x18 + 0x68) != 0)) {
      (**(code **)(in_RDI + (long)iVar1 * 0x18 + 0x68))
                (local_458,*(undefined8 *)(in_RDI + (long)iVar1 * 0x18 + 0x70),
                 (byte)(uVar2 >> 0x18) & 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::Print(int Level, const char *pFrom, const char *pStr, bool Highlighted)
{
	char aTimeBuf[80];
	str_timestamp_format(aTimeBuf, sizeof(aTimeBuf), FORMAT_TIME);

	char aBuf[1024];
	str_format(aBuf, sizeof(aBuf), "[%s][%s]: %s", aTimeBuf, pFrom, pStr);
	dbg_msg(pFrom ,"%s", pStr);
	for(int i = 0; i < m_NumPrintCB; ++i)
	{
		if(Level <= m_aPrintCB[i].m_OutputLevel && m_aPrintCB[i].m_pfnPrintCallback)
		{
			m_aPrintCB[i].m_pfnPrintCallback(aBuf, m_aPrintCB[i].m_pPrintCallbackUserdata, Highlighted);
		}
	}
}